

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
     UpdateStats(BitpackingCompressionState<signed_char,_true,_signed_char> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  undefined1 uVar2;
  pointer pCVar3;
  data_t dVar4;
  data_t dVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    dVar4 = (state->state).maximum;
    dVar5 = (pCVar3->stats).statistics.stats_union.string_data.max[0];
    if ((char)dVar4 <= (char)dVar5) {
      dVar5 = dVar4;
    }
    (pCVar3->stats).statistics.stats_union.string_data.max[0] = dVar5;
    dVar5 = *(data_t *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if ((char)dVar4 < (char)dVar5) {
      dVar4 = dVar5;
    }
    *(data_t *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = dVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar2 = (state->state).minimum;
    dVar4 = (pCVar3->stats).statistics.stats_union.string_data.max[0];
    if ((char)uVar2 <= (char)dVar4) {
      dVar4 = uVar2;
    }
    (pCVar3->stats).statistics.stats_union.string_data.max[0] = dVar4;
    dVar4 = *(data_t *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    dVar5 = uVar2;
    if ((char)uVar2 < (char)dVar4) {
      dVar5 = dVar4;
    }
    *(data_t *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = dVar5;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}